

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void wiznet(char *string,CHAR_DATA *ch,OBJ_DATA *obj,long flag,long flag_skip,int min_level)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long in_RCX;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  long in_R8;
  int in_R9D;
  __type_conflict2 _Var5;
  DESCRIPTOR_DATA *d;
  char str [4608];
  int in_stack_000012b0;
  int in_stack_000012b4;
  void *in_stack_000012b8;
  void *in_stack_000012c0;
  CHAR_DATA *in_stack_000012c8;
  char *in_stack_000012d0;
  CHAR_DATA *in_stack_ffffffffffffed78;
  char *in_stack_ffffffffffffed80;
  CHAR_DATA *in_stack_ffffffffffffed88;
  CHAR_DATA *in_stack_ffffffffffffed98;
  DESCRIPTOR_DATA *local_1240;
  CHAR_DATA local_1238 [5];
  int local_2c;
  long local_28;
  long local_20;
  CHAR_DATA *local_10;
  CHAR_DATA *local_8;
  
  local_1240 = descriptor_list;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    if (local_1240 == (DESCRIPTOR_DATA *)0x0) {
      return;
    }
    if (((((local_1240->connected == 0) && (local_1240->character != (CHAR_DATA *)0x0)) &&
         (bVar2 = is_immortal(in_stack_ffffffffffffed78), bVar2)) &&
        (uVar1 = local_1240->character->wiznet[0], _Var5 = std::pow<int,int>(0,0x58545c),
        (uVar1 & (long)_Var5) != 0)) &&
       ((local_20 == 0 ||
        (uVar1 = local_1240->character->wiznet[(int)(local_20 / 0x20)],
        _Var5 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                   (long)in_stack_ffffffffffffed78), (uVar1 & (long)_Var5) != 0))))
    {
      if (local_28 != 0) {
        in_stack_ffffffffffffed98 = local_1240->character;
        uVar1 = in_stack_ffffffffffffed98->wiznet[(int)(local_28 / 0x20)];
        _Var5 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                   (long)in_stack_ffffffffffffed78);
        if ((uVar1 & (long)_Var5) != 0) goto LAB_0058566c;
      }
      iVar3 = get_trust(in_stack_ffffffffffffed78);
      if ((local_2c <= iVar3) && (local_1240->character != local_10)) {
        pcVar4 = (char *)local_1240->character->wiznet[0];
        _Var5 = std::pow<int,int>(0,0x5855bb);
        if (((ulong)pcVar4 & (long)_Var5) != 0) {
          send_to_char(pcVar4,in_stack_ffffffffffffed88);
        }
        in_stack_ffffffffffffed78 = local_1238;
        in_stack_ffffffffffffed80 = get_char_color(in_stack_ffffffffffffed98,pcVar4);
        in_stack_ffffffffffffed88 = local_8;
        pcVar4 = END_COLOR(local_8);
        sprintf((char *)in_stack_ffffffffffffed78,"%s%s%s",in_stack_ffffffffffffed80,
                in_stack_ffffffffffffed88,pcVar4);
        act_new(in_stack_000012d0,in_stack_000012c8,in_stack_000012c0,in_stack_000012b8,
                in_stack_000012b4,in_stack_000012b0);
      }
    }
LAB_0058566c:
    local_1240 = local_1240->next;
  } while( true );
}

Assistant:

void wiznet(char *string, CHAR_DATA *ch, OBJ_DATA *obj, long flag, long flag_skip, int min_level)
{
	char str[MAX_STRING_LENGTH];

	for (DESCRIPTOR_DATA *d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character
			&& is_immortal(d->character)
			&& IS_SET(d->character->wiznet, WIZ_ON)
			&& (!flag || IS_SET(d->character->wiznet, flag))
			&& (!flag_skip || !IS_SET(d->character->wiznet, flag_skip))
			&& get_trust(d->character) >= min_level
			&& d->character != ch)
		{
			if (IS_SET(d->character->wiznet, WIZ_PREFIX))
				send_to_char("--> ", d->character);

			sprintf(str, "%s%s%s", get_char_color(d->character, "wiznet"), string, END_COLOR(d->character));
			act_new(str, d->character, obj, ch, TO_CHAR, POS_DEAD);
		}
	}
}